

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseEnum(Parser *this,bool is_union,EnumDef **dest,char *filename)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  BaseType BVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  ulong uVar2;
  EnumVal *__rhs;
  char cVar3;
  bool bVar4;
  BaseType BVar5;
  int iVar6;
  Value *pVVar7;
  EnumVal *pEVar8;
  StructDef *pSVar9;
  size_t sVar10;
  Type *e;
  pointer ppEVar11;
  CheckedError *ce;
  int t;
  undefined7 in_register_00000031;
  Parser *this_00;
  char *__s;
  string *psVar12;
  pointer ppEVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_R8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  pair<std::_Rb_tree_iterator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_bool>
  pVar15;
  EnumDef *enum_def;
  string qualified_name;
  set<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
  union_types;
  EnumValBuilder evb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  char *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enum_comment;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string enum_name;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,is_union);
  cVar3 = (char)dest;
  __x = &(this_00->super_ParserState).doc_comment_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&enum_comment,__x);
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001141b9;
  local_f0 = filename;
  CheckedError::~CheckedError((CheckedError *)this);
  psVar12 = &(this_00->super_ParserState).attribute_;
  std::__cxx11::string::string((string *)&enum_name,(string *)psVar12);
  t = (int)this_00;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    StartEnum(this,(string *)this_00,SUB81(&enum_name,0),(EnumDef **)((ulong)dest & 0xff));
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      if ((in_R8 != (char *)0x0) && ((this_00->opts).project_root._M_string_length != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&evb,in_R8,(allocator<char> *)&qualified_name);
        FilePath((string *)&union_types,&(this_00->opts).project_root,(string *)&evb,
                 (this_00->opts).binary_schema_absolute_paths);
        pVar14 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&this_00->string_cache_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &union_types);
        (enum_def->super_Definition).declaration_file = (string *)(pVar14.first._M_node._M_node + 1)
        ;
        std::__cxx11::string::~string((string *)&union_types);
        std::__cxx11::string::~string((string *)&evb);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(enum_def->super_Definition).doc_comment,&enum_comment);
      if ((this_00->opts).proto_mode == false) {
        if ((this_00->super_ParserState).token_ == 0x3a) {
          if ((cVar3 != '\0') && (((this_00->opts).lang_to_generate & 0xfffffffffffffcf7) != 0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&union_types,
                       "Underlying type for union is not yet supported in at least one of the specified programming languages."
                       ,(allocator<char> *)&evb);
            Error(this,(string *)this_00);
            goto LAB_001138c8;
          }
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001141ac;
          CheckedError::~CheckedError((CheckedError *)this);
          ParseType(this,(Type *)this_00);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001141ac;
          CheckedError::~CheckedError((CheckedError *)this);
          BVar1 = (enum_def->underlying_type).base_type;
          if (BVar1 != BASE_TYPE_BOOL && 0xfffffff5 < BVar1 - BASE_TYPE_FLOAT) {
            (enum_def->underlying_type).enum_def = enum_def;
            goto LAB_00113767;
          }
          __s = "enum";
          if (cVar3 != '\0') {
            __s = "union";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&qualified_name,__s,(allocator<char> *)&local_110);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&evb,
                         "underlying ",&qualified_name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &union_types,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&evb,
                         "type must be integral");
          Error(this,(string *)this_00);
          std::__cxx11::string::~string((string *)&union_types);
          std::__cxx11::string::~string((string *)&evb);
          psVar12 = &qualified_name;
        }
        else {
          if (cVar3 != '\0') goto LAB_00113767;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&union_types,
                     "must specify the underlying integer type for this enum (e.g. \': short\', which was the default)."
                     ,(allocator<char> *)&evb);
          Error(this,(string *)this_00);
LAB_001138c8:
          psVar12 = (string *)&union_types;
        }
        std::__cxx11::string::~string((string *)psVar12);
      }
      else {
LAB_00113767:
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)this_00);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          BVar1 = (enum_def->underlying_type).base_type;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&union_types,"bit_flags",(allocator<char> *)&evb);
          pVVar7 = SymbolTable<flatbuffers::Value>::Lookup
                             (&(enum_def->super_Definition).attributes,(string *)&union_types);
          if ((pVVar7 != (Value *)0x0) &&
             ((BASE_TYPE_ULONG < BVar1 ||
              ((0x552U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) == 0)))) {
            std::__cxx11::string::~string((string *)&union_types);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&union_types,"underlying type of bit_flags enum must be unsigned",
                       (allocator<char> *)&evb);
            Warning(this_00,(string *)&union_types);
          }
          std::__cxx11::string::~string((string *)&union_types);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&union_types,"force_align",(allocator<char> *)&evb);
          pVVar7 = SymbolTable<flatbuffers::Value>::Lookup
                             (&(enum_def->super_Definition).attributes,(string *)&union_types);
          std::__cxx11::string::~string((string *)&union_types);
          if (pVVar7 != (Value *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&union_types,"`force_align` is not a valid attribute for Enums. ",
                       (allocator<char> *)&evb);
            Error(this,(string *)this_00);
            goto LAB_001138c8;
          }
          evb.temp = (EnumVal *)0x0;
          evb.user_value = false;
          evb.parser = this_00;
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            if (((cVar3 != '\0') || ((this_00->super_ParserState).token_ == 0x7d)) &&
               ((this_00->opts).proto_mode == false)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&union_types,"NONE",(allocator<char> *)&qualified_name);
              EnumValBuilder::CreateEnumerator(&evb,(string *)&union_types);
              std::__cxx11::string::~string((string *)&union_types);
              EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001141a2;
              CheckedError::~CheckedError((CheckedError *)this);
            }
            union_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &union_types._M_t._M_impl.super__Rb_tree_header._M_header;
            union_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            union_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            union_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            union_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 union_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            while ((this_00->super_ParserState).token_ != 0x7d) {
              if (((this_00->opts).proto_mode == true) &&
                 (bVar4 = std::operator==(psVar12,"option"), bVar4)) {
                ParseProtoOption(this);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114198;
                CheckedError::~CheckedError((CheckedError *)this);
              }
              else {
                pEVar8 = EnumValBuilder::CreateEnumerator(&evb,psVar12);
                std::__cxx11::string::string((string *)&qualified_name,(string *)pEVar8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=(&pEVar8->doc_comment,__x);
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                CheckedError::~CheckedError((CheckedError *)this);
                if (cVar3 != '\0') {
                  ParseNamespacing(this,(string *)this_00,&qualified_name);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                  CheckedError::~CheckedError((CheckedError *)this);
                  if ((this_00->opts).union_value_namespacing == true) {
                    std::__cxx11::string::_M_assign((string *)pEVar8);
                    __first._M_current = (pEVar8->name)._M_dataplus._M_p;
                    local_110._M_dataplus._M_p._0_4_ =
                         CONCAT31(local_110._M_dataplus._M_p._1_3_,0x2e);
                    local_e8._M_dataplus._M_p._0_1_ = 0x5f;
                    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )(__first._M_current + (pEVar8->name)._M_string_length),
                               (char *)&local_110,(char *)&local_e8);
                  }
                  if ((this_00->super_ParserState).token_ == 0x3a) {
                    Next(this);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                    CheckedError::~CheckedError((CheckedError *)this);
                    ParseType(this,(Type *)this_00);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                    CheckedError::~CheckedError((CheckedError *)this);
                    BVar5 = (pEVar8->union_type).base_type;
                    if ((BVar5 | BASE_TYPE_BOOL) != BASE_TYPE_STRUCT) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_110,
                                 "union value type may only be table/struct/string",
                                 (allocator<char> *)&local_e8);
                      Error(this,(string *)this_00);
                      goto LAB_00114181;
                    }
                  }
                  else {
                    pSVar9 = LookupCreateStruct(this_00,&qualified_name,true,false);
                    (pEVar8->union_type).base_type = BASE_TYPE_STRUCT;
                    (pEVar8->union_type).element = BASE_TYPE_NONE;
                    (pEVar8->union_type).struct_def = pSVar9;
                    (pEVar8->union_type).enum_def = (EnumDef *)0x0;
                    (pEVar8->union_type).fixed_length = 0;
                    BVar5 = BASE_TYPE_STRUCT;
                  }
                  if (enum_def->uses_multiple_type_instances == false) {
                    local_110._M_string_length = (size_type)(pEVar8->union_type).struct_def;
                    local_110._M_dataplus._M_p._0_4_ = BVar5;
                    pVar15 = std::
                             _Rb_tree<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::_Identity<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::less<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::allocator<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>>
                             ::
                             _M_insert_unique<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>
                                       ((_Rb_tree<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>,std::_Identity<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::less<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>,std::allocator<std::pair<flatbuffers::BaseType,flatbuffers::StructDef*>>>
                                         *)&union_types,
                                        (pair<flatbuffers::BaseType,_flatbuffers::StructDef_*> *)
                                        &local_110);
                    enum_def->uses_multiple_type_instances = (bool)(~pVar15.second & 1);
                  }
                }
                iVar6 = (this_00->super_ParserState).token_;
                if (iVar6 == 0x3d) {
                  Next(this);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                  CheckedError::~CheckedError((CheckedError *)this);
                  EnumValBuilder::AssignEnumeratorValue((EnumValBuilder *)this,(string *)&evb);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                  CheckedError::~CheckedError((CheckedError *)this);
                  Expect(this,t);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                  CheckedError::~CheckedError((CheckedError *)this);
                  iVar6 = (this_00->super_ParserState).token_;
                }
                if (((this_00->opts).proto_mode == true) && (iVar6 == 0x5b)) {
                  Next(this);
                  while( true ) {
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                    CheckedError::~CheckedError((CheckedError *)this);
                    if ((this_00->super_ParserState).token_ == 0x5d) break;
                    Next(this);
                  }
                  Next(this);
                }
                else {
                  ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)this_00);
                }
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                CheckedError::~CheckedError((CheckedError *)this);
                EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011418e;
                CheckedError::~CheckedError((CheckedError *)this);
                std::__cxx11::string::~string((string *)&qualified_name);
              }
              iVar6 = 0x2c;
              if ((this_00->opts).proto_mode != false) {
                iVar6 = 0x3b;
              }
              if ((this_00->super_ParserState).token_ != iVar6) break;
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114198;
              CheckedError::~CheckedError((CheckedError *)this);
            }
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              if ((enum_def->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  (enum_def->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&qualified_name,"incomplete enum declaration, values not found"
                           ,(allocator<char> *)&local_110);
                Error(this,(string *)this_00);
LAB_0011418e:
                this_01 = &qualified_name;
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&qualified_name,"bit_flags",(allocator<char> *)&local_110);
                pVVar7 = SymbolTable<flatbuffers::Value>::Lookup
                                   (&(enum_def->super_Definition).attributes,&qualified_name);
                std::__cxx11::string::~string((string *)&qualified_name);
                if (pVVar7 != (Value *)0x0) {
                  sVar10 = SizeOf(BVar1);
                  ppEVar13 = (enum_def->vals).vec.
                             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppEVar11 = (enum_def->vals).vec.
                                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start; ppEVar11 != ppEVar13;
                      ppEVar11 = ppEVar11 + 1) {
                    uVar2 = (*ppEVar11)->value;
                    if (((BASE_TYPE_ULONG < BVar1) ||
                        ((0x552U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) == 0)) &&
                       (uVar2 == sVar10 * 8 - 1)) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&qualified_name,
                                 "underlying type of bit_flags enum must be unsigned",
                                 (allocator<char> *)&local_110);
                      Error(this,(string *)this_00);
                      goto LAB_0011418e;
                    }
                    if (sVar10 << 3 <= uVar2) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&qualified_name,
                                 "bit flag out of range of underlying integral type",
                                 (allocator<char> *)&local_110);
                      Error(this,(string *)this_00);
                      goto LAB_0011418e;
                    }
                    (*ppEVar11)->value = 1L << ((byte)uVar2 & 0x3f);
                  }
                }
                EnumDef::SortByValue(enum_def);
                ppEVar11 = (enum_def->vals).vec.
                           super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppEVar13 = ppEVar11;
                do {
                  ppEVar13 = ppEVar13 + 1;
                  if (ppEVar13 ==
                      (enum_def->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    if (local_f0 != (char *)0x0) {
                      *(EnumDef **)local_f0 = enum_def;
                    }
                    Namespace::GetFullyQualifiedName
                              (&qualified_name,this_00->current_namespace_,(string *)enum_def,1000);
                    e = (Type *)operator_new(0x20);
                    e->base_type = BASE_TYPE_UNION;
                    e->element = BASE_TYPE_NONE;
                    e->struct_def = (StructDef *)0x0;
                    e->enum_def = enum_def;
                    e->fixed_length = 0;
                    bVar4 = SymbolTable<flatbuffers::Type>::Add(&this_00->types_,&qualified_name,e);
                    if (bVar4) {
                      std::operator+(&local_110,"datatype already exists: ",&qualified_name);
                      Error(this,(string *)this_00);
LAB_00114181:
                      std::__cxx11::string::~string((string *)&local_110);
                    }
                    else {
                      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                    }
                    goto LAB_0011418e;
                  }
                  pEVar8 = *ppEVar11;
                  __rhs = *ppEVar13;
                } while (pEVar8->value != __rhs->value);
                std::operator+(&local_90,"all enum values must be unique: ",&pEVar8->name);
                std::operator+(&local_70,&local_90," and ");
                std::operator+(&local_e8,&local_70,&__rhs->name);
                std::operator+(&local_110,&local_e8," are both ");
                NumToString<long>(&local_b0,__rhs->value);
                std::operator+(&qualified_name,&local_110,&local_b0);
                Error(this,(string *)this_00);
                std::__cxx11::string::~string((string *)&qualified_name);
                std::__cxx11::string::~string((string *)&local_b0);
                std::__cxx11::string::~string((string *)&local_110);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::~string((string *)&local_70);
                this_01 = &local_90;
              }
              std::__cxx11::string::~string((string *)this_01);
            }
LAB_00114198:
            std::
            _Rb_tree<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>,_std::_Identity<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::less<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>,_std::allocator<std::pair<flatbuffers::BaseType,_flatbuffers::StructDef_*>_>_>
            ::~_Rb_tree(&union_types._M_t);
          }
LAB_001141a2:
          EnumValBuilder::~EnumValBuilder(&evb);
        }
      }
    }
  }
LAB_001141ac:
  std::__cxx11::string::~string((string *)&enum_name);
LAB_001141b9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&enum_comment);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseEnum(const bool is_union, EnumDef **dest,
                               const char *filename) {
  std::vector<std::string> enum_comment = doc_comment_;
  NEXT();
  std::string enum_name = attribute_;
  EXPECT(kTokenIdentifier);
  EnumDef *enum_def;
  ECHECK(StartEnum(enum_name, is_union, &enum_def));
  if (filename != nullptr && !opts.project_root.empty()) {
    enum_def->declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  enum_def->doc_comment = enum_comment;
  if (!opts.proto_mode) {
    // Give specialized error message, since this type spec used to
    // be optional in the first FlatBuffers release.
    bool explicit_underlying_type = false;
    if (!Is(':')) {
      // Enum is forced to have an explicit underlying type in declaration.
      if (!is_union) {
        return Error(
            "must specify the underlying integer type for this"
            " enum (e.g. \': short\', which was the default).");
      }
    } else {
      // Union underlying type is only supported for cpp
      if (is_union && !SupportsUnionUnderlyingType()) {
        return Error(
            "Underlying type for union is not yet supported in at least one of "
            "the specified programming languages.");
      }
      NEXT();
      explicit_underlying_type = true;
    }

    if (explicit_underlying_type) {
      // Specify the integer type underlying this enum.
      ECHECK(ParseType(enum_def->underlying_type));
      if (!IsInteger(enum_def->underlying_type.base_type) || IsBool(enum_def->underlying_type.base_type)) {
        return Error("underlying " + std::string(is_union ? "union" : "enum") + "type must be integral");
      }
        
      // Make this type refer back to the enum it was derived from.
      enum_def->underlying_type.enum_def = enum_def;
    }

  }
  ECHECK(ParseMetaData(&enum_def->attributes));
  const auto underlying_type = enum_def->underlying_type.base_type;
  if (enum_def->attributes.Lookup("bit_flags") &&
      !IsUnsigned(underlying_type)) {
    // todo: Convert to the Error in the future?
    Warning("underlying type of bit_flags enum must be unsigned");
  }
  if (enum_def->attributes.Lookup("force_align")) {
    return Error("`force_align` is not a valid attribute for Enums. ");
  }
  EnumValBuilder evb(*this, *enum_def);
  EXPECT('{');
  // A lot of code generatos expect that an enum is not-empty.
  if ((is_union || Is('}')) && !opts.proto_mode) {
    evb.CreateEnumerator("NONE");
    ECHECK(evb.AcceptEnumerator());
  }
  std::set<std::pair<BaseType, StructDef *>> union_types;
  while (!Is('}')) {
    if (opts.proto_mode && attribute_ == "option") {
      ECHECK(ParseProtoOption());
    } else {
      auto &ev = *evb.CreateEnumerator(attribute_);
      auto full_name = ev.name;
      ev.doc_comment = doc_comment_;
      EXPECT(kTokenIdentifier);
      if (is_union) {
        ECHECK(ParseNamespacing(&full_name, &ev.name));
        if (opts.union_value_namespacing) {
          // Since we can't namespace the actual enum identifiers, turn
          // namespace parts into part of the identifier.
          ev.name = full_name;
          std::replace(ev.name.begin(), ev.name.end(), '.', '_');
        }
        if (Is(':')) {
          NEXT();
          ECHECK(ParseType(ev.union_type));
          if (ev.union_type.base_type != BASE_TYPE_STRUCT &&
              ev.union_type.base_type != BASE_TYPE_STRING)
            return Error("union value type may only be table/struct/string");
        } else {
          ev.union_type = Type(BASE_TYPE_STRUCT, LookupCreateStruct(full_name));
        }
        if (!enum_def->uses_multiple_type_instances) {
          auto ins = union_types.insert(std::make_pair(
              ev.union_type.base_type, ev.union_type.struct_def));
          enum_def->uses_multiple_type_instances = (false == ins.second);
        }
      }

      if (Is('=')) {
        NEXT();
        ECHECK(evb.AssignEnumeratorValue(attribute_));
        EXPECT(kTokenIntegerConstant);
      }

      if (opts.proto_mode && Is('[')) {
        NEXT();
        // ignore attributes on enums.
        while (token_ != ']') NEXT();
        NEXT();
      } else {
        // parse attributes in fbs schema
        ECHECK(ParseMetaData(&ev.attributes));
      }

      ECHECK(evb.AcceptEnumerator());
    }
    if (!Is(opts.proto_mode ? ';' : ',')) break;
    NEXT();
  }
  EXPECT('}');

  // At this point, the enum can be empty if input is invalid proto-file.
  if (!enum_def->size())
    return Error("incomplete enum declaration, values not found");

  if (enum_def->attributes.Lookup("bit_flags")) {
    const auto base_width = static_cast<uint64_t>(8 * SizeOf(underlying_type));
    for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
         ++it) {
      auto ev = *it;
      const auto u = ev->GetAsUInt64();
      // Stop manipulations with the sign.
      if (!IsUnsigned(underlying_type) && u == (base_width - 1))
        return Error("underlying type of bit_flags enum must be unsigned");
      if (u >= base_width)
        return Error("bit flag out of range of underlying integral type");
      enum_def->ChangeEnumValue(ev, 1ULL << u);
    }
  }

  enum_def->SortByValue();  // Must be sorted to use MinValue/MaxValue.

  // Ensure enum value uniqueness.
  auto prev_it = enum_def->Vals().begin();
  for (auto it = prev_it + 1; it != enum_def->Vals().end(); ++it) {
    auto prev_ev = *prev_it;
    auto ev = *it;
    if (prev_ev->GetAsUInt64() == ev->GetAsUInt64())
      return Error("all enum values must be unique: " + prev_ev->name +
                   " and " + ev->name + " are both " +
                   NumToString(ev->GetAsInt64()));
  }

  if (dest) *dest = enum_def;
  const auto qualified_name =
      current_namespace_->GetFullyQualifiedName(enum_def->name);
  if (types_.Add(qualified_name, new Type(BASE_TYPE_UNION, nullptr, enum_def)))
    return Error("datatype already exists: " + qualified_name);
  return NoError();
}